

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_1::createSingleAllocCallbacksTest<vkt::api::(anonymous_namespace)::Buffer>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  PlatformInterface *pPVar1;
  Deleter<vk::VkInstance_s_*> **ppDVar2;
  bool bVar3;
  int iVar4;
  VkAllocationCallbacks *pVVar5;
  DeviceInterface *pDVar6;
  VkDevice pVVar7;
  Environment rootEnv;
  AllocationCallbackRecorder objCallbacks;
  AllocationCallbackRecorder resCallbacks;
  Environment objEnv;
  VkBufferCreateInfo local_8a0;
  VkBuffer local_868;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_860;
  Environment local_840;
  Move<vk::Handle<(vk::HandleType)8>_> local_808;
  AllocationCallbackRecorder local_7e8;
  AllocationCallbackRecorder local_788;
  EnvClone local_728;
  PlatformInterface *local_68;
  DeviceInterface *local_60;
  VkDevice local_58;
  deUint32 local_50 [2];
  BinaryCollection *local_48;
  VkAllocationCallbacks *local_40;
  deUint32 local_38;
  
  pVVar5 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_788,pVVar5,0x80);
  pPVar1 = *(PlatformInterface **)(this + 8);
  pDVar6 = Context::getDeviceInterface((Context *)this);
  pVVar7 = Context::getDevice((Context *)this);
  local_840.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_840.programBinaries = *(BinaryCollection **)(this + 0x10);
  local_840.allocationCallbacks =
       &local_788.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  local_840.maxResourceConsumers = 1;
  local_840.vkp = pPVar1;
  local_840.vkd = pDVar6;
  local_840.device = pVVar7;
  iVar4 = tcu::CommandLine::getVKDeviceId(*(CommandLine **)(*(long *)this + 0x18));
  local_7e8.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
       (_func_int **)((ulong)(iVar4 - 1U) | 0x300000000);
  EnvClone::EnvClone(&local_728,&local_840,(Parameters *)&local_7e8,iVar4 - 1U);
  pVVar5 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_7e8,pVVar5,0x80);
  local_40 = &local_7e8.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  local_8a0.pQueueFamilyIndices = local_50;
  local_68 = local_728.env.vkp;
  local_60 = local_728.env.vkd;
  local_58 = local_728.env.device;
  local_50[0] = local_728.env.queueFamilyIndex;
  local_48 = local_728.env.programBinaries;
  local_38 = local_728.env.maxResourceConsumers;
  local_8a0.sType = 0xc;
  local_8a0.pNext = (void *)0x0;
  local_8a0.flags = 0;
  local_8a0.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_8a0.queueFamilyIndexCount = 1;
  local_8a0.size = (VkDeviceSize)context;
  local_8a0.usage = (VkBufferUsageFlags)params.size;
  ::vk::createBuffer(&local_808,local_728.env.vkd,local_728.env.device,&local_8a0,local_40);
  local_868.m_internal =
       local_808.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  DStack_860.m_deviceIface =
       local_808.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  DStack_860.m_device =
       local_808.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  DStack_860.m_allocator =
       local_808.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  bVar3 = ::vk::validateAndLog(*(TestLog **)(*(long *)this + 0x10),&local_7e8,0x1e);
  if (bVar3) {
    if (local_868.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_860,local_868);
    }
    bVar3 = ::vk::validateAndLog(*(TestLog **)(*(long *)this + 0x10),&local_7e8,0);
    if (bVar3) {
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_7e8);
      ::vk::DeviceDriver::~DeviceDriver(&local_728.vkd);
      if (local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
        (*local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
                  (local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
      }
      local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
      local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
           (DestroyDeviceFunc)0x0;
      local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      ::vk::InstanceDriver::~InstanceDriver(&local_728.deviceRes.vki);
      if (local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object !=
          (VkInstance)0x0) {
        (*local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
          m_destroyInstance)
                  (local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object,local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.
                          m_data.deleter.m_allocator);
      }
      bVar3 = ::vk::validateAndLog(*(TestLog **)(*(long *)this + 0x10),&local_788,0);
      ppDVar2 = (Deleter<vk::VkInstance_s_*> **)
                &local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                 deleter;
      local_728.deviceRes.instance._0_8_ = ppDVar2;
      if (bVar3) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"Ok","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,
                   local_728.deviceRes.instance._0_8_,
                   local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object + local_728.deviceRes.instance._0_8_);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_728,"Invalid allocation callback","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,
                   local_728.deviceRes.instance._0_8_,
                   local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object + local_728.deviceRes.instance._0_8_);
      }
      if ((Deleter<vk::VkInstance_s_*> **)local_728.deviceRes.instance._0_8_ != ppDVar2) {
        operator_delete((void *)local_728.deviceRes.instance._0_8_,
                        (ulong)(local_728.deviceRes.instance.object.
                                super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance +
                               1));
      }
      goto LAB_003ec0c3;
    }
    local_8a0._0_8_ = (void *)((long)&local_8a0 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_8a0,"Invalid allocation callback","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_8a0._0_8_,
               (long)local_8a0.pNext + local_8a0._0_8_);
    if ((void *)local_8a0._0_8_ != (void *)((long)&local_8a0 + 0x10U)) {
      operator_delete((void *)local_8a0._0_8_,CONCAT44(local_8a0._20_4_,local_8a0.flags) + 1);
    }
  }
  else {
    local_8a0._0_8_ = (void *)((long)&local_8a0 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_8a0,"Invalid allocation callback","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_8a0._0_8_,
               (long)local_8a0.pNext + local_8a0._0_8_);
    if ((void *)local_8a0._0_8_ != (void *)((long)&local_8a0 + 0x10U)) {
      operator_delete((void *)local_8a0._0_8_,CONCAT44(local_8a0._20_4_,local_8a0.flags) + 1);
    }
    if (local_868.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_860,local_868);
    }
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_7e8);
  ::vk::DeviceDriver::~DeviceDriver(&local_728.vkd);
  if (local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
    (*local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
              (local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,
               local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  }
  local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
  local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
       (DestroyDeviceFunc)0x0;
  local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::InstanceDriver::~InstanceDriver(&local_728.deviceRes.vki);
  if (local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object !=
      (VkInstance)0x0) {
    (*local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_destroyInstance)
              (local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
               m_allocator);
  }
LAB_003ec0c3:
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_788);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleAllocCallbacksTest (Context& context, typename Object::Parameters params)
{
	const deUint32						noCmdScope		= (1u << VK_SYSTEM_ALLOCATION_SCOPE_INSTANCE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_DEVICE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_CACHE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_OBJECT);

	// Callbacks used by resources
	AllocationCallbackRecorder			resCallbacks	(getSystemAllocator(), 128);

	// Root environment still uses default instance and device, created without callbacks
	const Environment					rootEnv			(context.getPlatformInterface(),
														 context.getDeviceInterface(),
														 context.getDevice(),
														 context.getUniversalQueueFamilyIndex(),
														 context.getBinaryCollection(),
														 resCallbacks.getCallbacks(),
														 1u);

	{
		// Test env has instance & device created with callbacks
		const EnvClone						resEnv		(rootEnv, getDefaulDeviceParameters(context), 1u);
		const typename Object::Resources	res			(resEnv.env, params);

		// Supply a separate callback recorder just for object construction
		AllocationCallbackRecorder			objCallbacks(getSystemAllocator(), 128);
		const Environment					objEnv		(resEnv.env.vkp,
														 resEnv.env.vkd,
														 resEnv.env.device,
														 resEnv.env.queueFamilyIndex,
														 resEnv.env.programBinaries,
														 objCallbacks.getCallbacks(),
														 resEnv.env.maxResourceConsumers);

		{
			Unique<typename Object::Type>	obj	(Object::create(objEnv, res, params));

			// Validate that no command-level allocations are live
			if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, noCmdScope))
				return tcu::TestStatus::fail("Invalid allocation callback");
		}

		// At this point all allocations made against object callbacks must have been freed
		if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, 0u))
			return tcu::TestStatus::fail("Invalid allocation callback");
	}

	if (!validateAndLog(context.getTestContext().getLog(), resCallbacks, 0u))
		return tcu::TestStatus::fail("Invalid allocation callback");

	return tcu::TestStatus::pass("Ok");
}